

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

BinaryOp __thiscall
wasm::OptimizeInstructions::makeUnsignedBinaryOp(OptimizeInstructions *this,BinaryOp op)

{
  BinaryOp op_local;
  OptimizeInstructions *this_local;
  
  switch(op) {
  case DivSInt32:
    this_local._4_4_ = DivUInt32;
    break;
  default:
    this_local._4_4_ = InvalidBinary;
    break;
  case RemSInt32:
    this_local._4_4_ = RemUInt32;
    break;
  case ShrSInt32:
    this_local._4_4_ = ShrUInt32;
    break;
  case LtSInt32:
    this_local._4_4_ = LtUInt32;
    break;
  case LeSInt32:
    this_local._4_4_ = LeUInt32;
    break;
  case GtSInt32:
    this_local._4_4_ = GtUInt32;
    break;
  case GeSInt32:
    this_local._4_4_ = GeUInt32;
    break;
  case DivSInt64:
    this_local._4_4_ = DivUInt64;
    break;
  case RemSInt64:
    this_local._4_4_ = RemUInt64;
    break;
  case ShrSInt64:
    this_local._4_4_ = ShrUInt64;
    break;
  case LtSInt64:
    this_local._4_4_ = LtUInt64;
    break;
  case LeSInt64:
    this_local._4_4_ = LeUInt64;
    break;
  case GtSInt64:
    this_local._4_4_ = GtUInt64;
    break;
  case GeSInt64:
    this_local._4_4_ = GeUInt64;
  }
  return this_local._4_4_;
}

Assistant:

BinaryOp makeUnsignedBinaryOp(BinaryOp op) {
    switch (op) {
      case DivSInt32:
        return DivUInt32;
      case RemSInt32:
        return RemUInt32;
      case ShrSInt32:
        return ShrUInt32;
      case LtSInt32:
        return LtUInt32;
      case LeSInt32:
        return LeUInt32;
      case GtSInt32:
        return GtUInt32;
      case GeSInt32:
        return GeUInt32;

      case DivSInt64:
        return DivUInt64;
      case RemSInt64:
        return RemUInt64;
      case ShrSInt64:
        return ShrUInt64;
      case LtSInt64:
        return LtUInt64;
      case LeSInt64:
        return LeUInt64;
      case GtSInt64:
        return GtUInt64;
      case GeSInt64:
        return GeUInt64;

      default:
        return InvalidBinary;
    }
  }